

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

QString * defaultLibexecDir(void)

{
  QString *in_RDI;
  QLatin1StringView QVar1;
  undefined1 in_stack_00000010 [16];
  char *in_stack_ffffffffffffffe8;
  
  QVar1 = Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffffe8,(size_t)in_RDI);
  QString::QString((QString *)QVar1.m_data,(QLatin1StringView)in_stack_00000010);
  return in_RDI;
}

Assistant:

QString defaultLibexecDir()
{
#ifdef Q_OS_WIN32
    return "bin"_L1;
#else
    return "libexec"_L1;
#endif
}